

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

void cleanup_mon_base(void)

{
  monster_base *pmVar1;
  monster_base *p;
  
  p = rb_info;
  if (rb_info != (monster_base *)0x0) {
    do {
      pmVar1 = p->next;
      string_free(p->text);
      string_free(p->name);
      mem_free(p);
      p = pmVar1;
    } while (pmVar1 != (monster_base *)0x0);
  }
  return;
}

Assistant:

static void cleanup_mon_base(void)
{
	struct monster_base *rb, *next;

	rb = rb_info;
	while (rb) {
		next = rb->next;
		string_free(rb->text);
		string_free(rb->name);
		mem_free(rb);
		rb = next;
	}
}